

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O1

_Bool av1_get_uniform_tile_size(AV1_COMMON *cm,int *w,int *h)

{
  SequenceHeader *pSVar1;
  long lVar2;
  int iVar3;
  
  if ((cm->tiles).uniform_spacing == 0) {
    if (0 < (cm->tiles).cols) {
      pSVar1 = cm->seq_params;
      lVar2 = 0;
      do {
        iVar3 = ((cm->tiles).col_start_sb[lVar2 + 1] - (cm->tiles).col_start_sb[lVar2]) *
                pSVar1->mib_size;
        if ((lVar2 != 0) && (iVar3 != *w)) {
          return false;
        }
        lVar2 = lVar2 + 1;
        *w = iVar3;
      } while (lVar2 < (cm->tiles).cols);
    }
    if (0 < (cm->tiles).rows) {
      pSVar1 = cm->seq_params;
      lVar2 = 0;
      do {
        iVar3 = ((cm->tiles).row_start_sb[lVar2 + 1] - (cm->tiles).row_start_sb[lVar2]) *
                pSVar1->mib_size;
        if ((lVar2 != 0) && (iVar3 != *h)) {
          return false;
        }
        lVar2 = lVar2 + 1;
        *h = iVar3;
      } while (lVar2 < (cm->tiles).rows);
    }
  }
  else {
    *w = (cm->tiles).width;
    *h = (cm->tiles).height;
  }
  return true;
}

Assistant:

bool av1_get_uniform_tile_size(const AV1_COMMON *cm, int *w, int *h) {
  const CommonTileParams *const tiles = &cm->tiles;
  if (tiles->uniform_spacing) {
    *w = tiles->width;
    *h = tiles->height;
  } else {
    for (int i = 0; i < tiles->cols; ++i) {
      const int tile_width_sb =
          tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      const int tile_w = tile_width_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_w != *w) {
        return false;
      }
      *w = tile_w;
    }

    for (int i = 0; i < tiles->rows; ++i) {
      const int tile_height_sb =
          tiles->row_start_sb[i + 1] - tiles->row_start_sb[i];
      const int tile_h = tile_height_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_h != *h) {
        return false;
      }
      *h = tile_h;
    }
  }
  return true;
}